

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O0

void __thiscall WriterTest_WriteInt_Test::TestBody(WriterTest_WriteInt_Test *this)

{
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  AssertHelper *in_stack_fffffffffffffe30;
  AssertionResult *pAVar5;
  char *in_stack_fffffffffffffe40;
  undefined8 in_stack_fffffffffffffe48;
  int iVar6;
  undefined7 in_stack_fffffffffffffe50;
  undefined1 in_stack_fffffffffffffe57;
  uint *in_stack_fffffffffffffe58;
  Type type;
  AssertHelper *in_stack_fffffffffffffe60;
  AssertionResult *this_00;
  undefined7 in_stack_fffffffffffffe68;
  undefined1 in_stack_fffffffffffffe6f;
  Message *in_stack_fffffffffffffea8;
  AssertionResult *this_01;
  undefined7 in_stack_fffffffffffffeb0;
  undefined1 in_stack_fffffffffffffeb7;
  AssertionResult local_118 [2];
  int local_f8;
  AssertionResult local_f0 [2];
  int local_d0;
  AssertionResult local_c8 [2];
  undefined4 local_a8;
  AssertionResult local_a0 [2];
  undefined2 local_7c;
  AssertionResult local_78 [2];
  undefined4 local_58;
  AssertionResult local_50 [3];
  undefined4 local_20;
  AssertionResult local_18;
  
  iVar6 = (int)((ulong)in_stack_fffffffffffffe48 >> 0x20);
  local_20 = 0x2a;
  (anonymous_namespace)::AnyWriteChecker::operator()
            ((AnyWriteChecker *)CONCAT17(in_stack_fffffffffffffe6f,in_stack_fffffffffffffe68),
             (char *)in_stack_fffffffffffffe60,(int *)in_stack_fffffffffffffe58);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_18);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffe60);
    testing::AssertionResult::failure_message((AssertionResult *)0x128f63);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffe60,(Type)((ulong)in_stack_fffffffffffffe58 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50),iVar6,
               in_stack_fffffffffffffe40);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0),
               in_stack_fffffffffffffea8);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffe30);
    testing::Message::~Message((Message *)0x128fc6);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x12901b);
  local_58 = 0xffffffd6;
  this_01 = local_50;
  (anonymous_namespace)::AnyWriteChecker::operator()
            ((AnyWriteChecker *)CONCAT17(in_stack_fffffffffffffe6f,in_stack_fffffffffffffe68),
             (char *)in_stack_fffffffffffffe60,(int *)in_stack_fffffffffffffe58);
  uVar2 = testing::AssertionResult::operator_cast_to_bool(this_01);
  if (!(bool)uVar2) {
    testing::Message::Message((Message *)in_stack_fffffffffffffe60);
    testing::AssertionResult::failure_message((AssertionResult *)0x1290c1);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffe60,(Type)((ulong)in_stack_fffffffffffffe58 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50),iVar6,
               in_stack_fffffffffffffe40);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(uVar2,in_stack_fffffffffffffeb0),(Message *)this_01);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffe30);
    testing::Message::~Message((Message *)0x12911e);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x129173);
  local_7c = 0xc;
  (anonymous_namespace)::AnyWriteChecker::operator()
            ((AnyWriteChecker *)CONCAT17(in_stack_fffffffffffffe6f,in_stack_fffffffffffffe68),
             (char *)in_stack_fffffffffffffe60,(short *)in_stack_fffffffffffffe58);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_78);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffe60);
    testing::AssertionResult::failure_message((AssertionResult *)0x12920c);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffe60,(Type)((ulong)in_stack_fffffffffffffe58 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50),iVar6,
               in_stack_fffffffffffffe40);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(uVar2,in_stack_fffffffffffffeb0),(Message *)this_01);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffe30);
    testing::Message::~Message((Message *)0x129269);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1292be);
  local_a8 = 0x22;
  (anonymous_namespace)::AnyWriteChecker::operator()
            ((AnyWriteChecker *)CONCAT17(in_stack_fffffffffffffe6f,in_stack_fffffffffffffe68),
             (char *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_a0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffe60);
    testing::AssertionResult::failure_message((AssertionResult *)0x129358);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffe60,(Type)((ulong)in_stack_fffffffffffffe58 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50),iVar6,
               in_stack_fffffffffffffe40);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(uVar2,in_stack_fffffffffffffeb0),(Message *)this_01);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffe30);
    testing::Message::~Message((Message *)0x1293b5);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x12940a);
  local_d0 = std::numeric_limits<int>::min();
  this_00 = local_c8;
  (anonymous_namespace)::AnyWriteChecker::operator()
            ((AnyWriteChecker *)CONCAT17(in_stack_fffffffffffffe6f,in_stack_fffffffffffffe68),
             &this_00->success_,(int *)in_stack_fffffffffffffe58);
  uVar3 = testing::AssertionResult::operator_cast_to_bool(this_00);
  if (!(bool)uVar3) {
    testing::Message::Message((Message *)this_00);
    in_stack_fffffffffffffe58 =
         (uint *)testing::AssertionResult::failure_message((AssertionResult *)0x1294a5);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_00,(Type)((ulong)in_stack_fffffffffffffe58 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50),iVar6,
               in_stack_fffffffffffffe40);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(uVar2,in_stack_fffffffffffffeb0),(Message *)this_01);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffe30);
    testing::Message::~Message((Message *)0x129502);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x129557);
  local_f8 = std::numeric_limits<int>::max();
  pAVar5 = local_f0;
  (anonymous_namespace)::AnyWriteChecker::operator()
            ((AnyWriteChecker *)CONCAT17(uVar3,in_stack_fffffffffffffe68),&this_00->success_,
             (int *)in_stack_fffffffffffffe58);
  uVar4 = testing::AssertionResult::operator_cast_to_bool(pAVar5);
  iVar6 = (int)((ulong)pAVar5 >> 0x20);
  if (!(bool)uVar4) {
    testing::Message::Message((Message *)this_00);
    in_stack_fffffffffffffe40 =
         testing::AssertionResult::failure_message((AssertionResult *)0x1295f2);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_00,(Type)((ulong)in_stack_fffffffffffffe58 >> 0x20),
               (char *)CONCAT17(uVar4,in_stack_fffffffffffffe50),iVar6,in_stack_fffffffffffffe40);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(uVar2,in_stack_fffffffffffffeb0),(Message *)this_01);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffe30);
    testing::Message::~Message((Message *)0x12964f);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1296a4);
  std::numeric_limits<unsigned_int>::max();
  pAVar5 = local_118;
  (anonymous_namespace)::AnyWriteChecker::operator()
            ((AnyWriteChecker *)CONCAT17(uVar3,in_stack_fffffffffffffe68),&this_00->success_,
             in_stack_fffffffffffffe58);
  type = (Type)((ulong)in_stack_fffffffffffffe58 >> 0x20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar5);
  if (!bVar1) {
    testing::Message::Message((Message *)this_00);
    testing::AssertionResult::failure_message((AssertionResult *)0x12973f);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_00,type,(char *)CONCAT17(uVar4,in_stack_fffffffffffffe50),iVar6,
               in_stack_fffffffffffffe40);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(uVar2,in_stack_fffffffffffffeb0),(Message *)this_01);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)pAVar5);
    testing::Message::~Message((Message *)0x12979a);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1297ef);
  return;
}

Assistant:

TEST(WriterTest, WriteInt) {
  CHECK_WRITE(42);
  CHECK_WRITE(-42);
  CHECK_WRITE(static_cast<short>(12));
  CHECK_WRITE(34u);
  CHECK_WRITE(std::numeric_limits<int>::min());
  CHECK_WRITE(std::numeric_limits<int>::max());
  CHECK_WRITE(std::numeric_limits<unsigned>::max());
}